

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>_> *
__thiscall
kj::_::ExceptionOr<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>_>
::operator=(ExceptionOr<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>_>
            *this,ExceptionOr<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>_>
                  *param_1)

{
  NullableValue<kj::Exception>::operator=
            ((NullableValue<kj::Exception> *)this,(NullableValue<kj::Exception> *)param_1);
  NullableValue<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>_>::
  operator=(&(this->value).ptr,&(param_1->value).ptr);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;